

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O3

void __thiscall
deqp::gls::LongStressCaseInternal::Texture::setData
          (Texture *this,ConstPixelBufferAccess *src,int width,int height,deUint32 internalFormat,
          bool useMipmap)

{
  int iVar1;
  TransferFormat TVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  undefined7 in_register_00000089;
  int iVar6;
  long lVar7;
  int iVar8;
  
  TVar2 = glu::getTransferFormat(src->m_format);
  iVar5 = 1;
  if ((int)CONCAT71(in_register_00000089,useMipmap) != 0) {
    uVar4 = height;
    if (height < width) {
      uVar4 = width;
    }
    uVar3 = 0x20;
    if (uVar4 != 0) {
      uVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      uVar3 = uVar3 ^ 0x1f;
    }
    iVar5 = 0x20 - uVar3;
  }
  this->m_numMipLevels = iVar5;
  this->m_internalFormat = internalFormat;
  iVar5 = tcu::TextureFormat::getPixelSize(&src->m_format);
  this->m_dataSizeApprox =
       ((uint)(this->m_type == TEXTURETYPE_CUBE) * 5 + 1) * iVar5 * height * width;
  uVar3 = tcu::TextureFormat::getPixelSize(&src->m_format);
  uVar4 = 8;
  if ((int)uVar3 < 8) {
    uVar4 = uVar3;
  }
  if ((uVar3 & uVar3 - 1) != 0) {
    uVar4 = 1;
  }
  glwPixelStorei(0xcf5,uVar4);
  if (this->m_type == TEXTURETYPE_CUBE) {
    this->m_dataSizeApprox = 0;
    glwBindTexture(0x8513,this->m_textureGL);
    if (0 < this->m_numMipLevels) {
      iVar5 = 0;
      do {
        iVar8 = width >> ((byte)iVar5 & 0x1f);
        if (iVar8 < 2) {
          iVar8 = 1;
        }
        iVar6 = height >> ((byte)iVar5 & 0x1f);
        if (iVar6 < 2) {
          iVar6 = 1;
        }
        iVar1 = tcu::TextureFormat::getPixelSize(&src->m_format);
        this->m_dataSizeApprox = this->m_dataSizeApprox + iVar1 * iVar8 * iVar6 * 6;
        lVar7 = 0;
        do {
          glwTexImage2D(*(GLenum *)((long)&DAT_01cb0e5c + lVar7),iVar5,internalFormat,iVar8,iVar6,0,
                        TVar2.format,TVar2.dataType,src->m_data);
          lVar7 = lVar7 + 4;
        } while ((int)lVar7 != 0x18);
        iVar5 = iVar5 + 1;
      } while (iVar5 < this->m_numMipLevels);
    }
  }
  else if (this->m_type == TEXTURETYPE_2D) {
    this->m_dataSizeApprox = 0;
    glwBindTexture(0xde1,this->m_textureGL);
    if (0 < this->m_numMipLevels) {
      iVar5 = 0;
      do {
        iVar8 = width >> ((byte)iVar5 & 0x1f);
        if (iVar8 < 2) {
          iVar8 = 1;
        }
        iVar6 = height >> ((byte)iVar5 & 0x1f);
        if (iVar6 < 2) {
          iVar6 = 1;
        }
        iVar1 = tcu::TextureFormat::getPixelSize(&src->m_format);
        this->m_dataSizeApprox = this->m_dataSizeApprox + iVar1 * iVar8 * iVar6;
        glwTexImage2D(0xde1,iVar5,internalFormat,iVar8,iVar6,0,TVar2.format,TVar2.dataType,
                      src->m_data);
        iVar5 = iVar5 + 1;
      } while (iVar5 < this->m_numMipLevels);
    }
  }
  return;
}

Assistant:

void Texture::setData (const ConstPixelBufferAccess& src, const int width, const int height, const deUint32 internalFormat, const bool useMipmap)
{
	DE_ASSERT(m_type != TEXTURETYPE_CUBE || width == height);
	DE_ASSERT(!useMipmap || (deIsPowerOfTwo32(width) && deIsPowerOfTwo32(height)));

	const TextureFormat&		format		= src.getFormat();
	const glu::TransferFormat	transfer	= glu::getTransferFormat(format);

	m_numMipLevels = useMipmap ? deLog2Floor32(de::max(width, height))+1 : 1;

	m_internalFormat = internalFormat;
	m_dataSizeApprox = width * height * format.getPixelSize() * (m_type == TEXTURETYPE_CUBE ? 6 : 1);

	DE_ASSERT(src.getRowPitch() == format.getPixelSize()*src.getWidth());
	DE_ASSERT(isMatchingGLInternalFormat(internalFormat, format));
	DE_ASSERT(width <= src.getWidth() && height <= src.getHeight());

	glPixelStorei(GL_UNPACK_ALIGNMENT, computePixelStore(format));

	if (m_type == TEXTURETYPE_2D)
	{
		m_dataSizeApprox = 0;

		glBindTexture(GL_TEXTURE_2D, m_textureGL);
		for (int level = 0; level < m_numMipLevels; level++)
		{
			const int levelWid = de::max(1, width>>level);
			const int levelHei = de::max(1, height>>level);
			m_dataSizeApprox += levelWid * levelHei * format.getPixelSize();
			glTexImage2D(GL_TEXTURE_2D, level, internalFormat, levelWid, levelHei, 0, transfer.format, transfer.dataType, src.getDataPtr());
		}
	}
	else if (m_type == TEXTURETYPE_CUBE)
	{
		m_dataSizeApprox = 0;

		glBindTexture(GL_TEXTURE_CUBE_MAP, m_textureGL);
		for (int level = 0; level < m_numMipLevels; level++)
		{
			const int levelWid = de::max(1, width>>level);
			const int levelHei = de::max(1, height>>level);
			m_dataSizeApprox += 6 * levelWid * levelHei * format.getPixelSize();
			for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
				glTexImage2D(cubeFaceToGLFace((CubeFace)face), level, internalFormat, levelWid, levelHei, 0, transfer.format, transfer.dataType, src.getDataPtr());
		}
	}
	else
		DE_ASSERT(false);
}